

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

int32_t array_container_number_of_runs(array_container_t *ac)

{
  uint16_t *p;
  int32_t prev;
  int32_t nr_runs;
  array_container_t *ac_local;
  
  nr_runs = 0;
  prev = -2;
  for (p = ac->array; p != ac->array + ac->cardinality; p = p + 1) {
    if ((uint)*p != prev + 1U) {
      nr_runs = nr_runs + 1;
    }
    prev = (int32_t)*p;
  }
  return nr_runs;
}

Assistant:

int32_t array_container_number_of_runs(const array_container_t *ac) {
    // Can SIMD work here?
    int32_t nr_runs = 0;
    int32_t prev = -2;
    for (const uint16_t *p = ac->array; p != ac->array + ac->cardinality; ++p) {
        if (*p != prev + 1) nr_runs++;
        prev = *p;
    }
    return nr_runs;
}